

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  uchar *puVar4;
  long lVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uchar *puVar12;
  
  puVar4 = data;
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/stb/stb_image.h"
                    ,0x634,
                    "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                   );
    }
    puVar4 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar4 == (uchar *)0x0) {
      free(data);
      stbi__g_failure_reason = "outofmem";
      puVar4 = (uchar *)0x0;
    }
    else {
      if (0 < (int)y) {
        uVar9 = req_comp + img_n * 8;
        if ((0x23 < uVar9) || ((0xe161a1c00U >> ((ulong)uVar9 & 0x3f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/stb/stb_image.h"
                        ,0x651,
                        "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                       );
        }
        iVar3 = x - 1;
        uVar8 = 0;
        uVar7 = 0;
        uVar10 = 0;
        do {
          iVar11 = (int)uVar10 * x;
          if (uVar9 - 10 < 0x19) {
            pbVar6 = data + (uint)(iVar11 * img_n);
            switch(uVar9) {
            case 10:
              if (-1 < iVar3) {
                lVar5 = 0;
                do {
                  puVar4[lVar5 * 2 + uVar7] = data[lVar5 + uVar8];
                  puVar4[lVar5 * 2 + uVar7 + 1] = 0xff;
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0xb:
              if (-1 < iVar3) {
                puVar12 = puVar4 + uVar7 + 2;
                lVar5 = 0;
                do {
                  uVar2 = data[lVar5 + uVar8];
                  *puVar12 = uVar2;
                  puVar12[-1] = uVar2;
                  puVar12[-2] = uVar2;
                  lVar5 = lVar5 + 1;
                  puVar12 = puVar12 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0xc:
              if (-1 < iVar3) {
                lVar5 = 0;
                do {
                  uVar2 = data[lVar5 + uVar8];
                  puVar4[lVar5 * 4 + uVar7 + 2] = uVar2;
                  puVar4[lVar5 * 4 + uVar7 + 1] = uVar2;
                  puVar4[lVar5 * 4 + uVar7] = uVar2;
                  puVar4[lVar5 * 4 + uVar7 + 3] = 0xff;
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            default:
              goto switchD_0012a56d_caseD_d;
            case 0x11:
              if (-1 < iVar3) {
                lVar5 = 0;
                do {
                  puVar4[lVar5 + uVar7] = data[lVar5 * 2 + uVar8];
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x13:
              if (-1 < iVar3) {
                puVar12 = puVar4 + uVar7 + 2;
                lVar5 = 0;
                do {
                  uVar2 = data[lVar5 * 2 + uVar8];
                  *puVar12 = uVar2;
                  puVar12[-1] = uVar2;
                  puVar12[-2] = uVar2;
                  lVar5 = lVar5 + 1;
                  puVar12 = puVar12 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x14:
              if (-1 < iVar3) {
                lVar5 = 0;
                do {
                  uVar2 = data[lVar5 * 2 + uVar8];
                  puVar4[lVar5 * 4 + uVar7 + 2] = uVar2;
                  puVar4[lVar5 * 4 + uVar7 + 1] = uVar2;
                  puVar4[lVar5 * 4 + uVar7] = uVar2;
                  puVar4[lVar5 * 4 + uVar7 + 3] = data[lVar5 * 2 + uVar8 + 1];
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x19:
              if (-1 < iVar3) {
                lVar5 = 0;
                do {
                  bVar1 = pbVar6[2];
                  puVar4[lVar5 + uVar7] =
                       (uchar)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                               (uint)pbVar6[1] * 0x96 + (uint)*pbVar6 * 0x4d >> 8);
                  lVar5 = lVar5 + 1;
                  pbVar6 = pbVar6 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x1a:
              if (-1 < iVar3) {
                lVar5 = 0;
                do {
                  bVar1 = pbVar6[2];
                  puVar4[lVar5 * 2 + uVar7] =
                       (uchar)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                               (uint)pbVar6[1] * 0x96 + (uint)*pbVar6 * 0x4d >> 8);
                  puVar4[lVar5 * 2 + uVar7 + 1] = 0xff;
                  lVar5 = lVar5 + 1;
                  pbVar6 = pbVar6 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x1c:
              if (-1 < iVar3) {
                lVar5 = 0;
                do {
                  puVar4[lVar5 * 4 + uVar7] = *pbVar6;
                  puVar4[lVar5 * 4 + uVar7 + 1] = pbVar6[1];
                  puVar4[lVar5 * 4 + uVar7 + 2] = pbVar6[2];
                  puVar4[lVar5 * 4 + uVar7 + 3] = 0xff;
                  lVar5 = lVar5 + 1;
                  pbVar6 = pbVar6 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x21:
              if (-1 < iVar3) {
                lVar5 = 0;
                do {
                  bVar1 = data[lVar5 * 4 + uVar8 + 2];
                  puVar4[lVar5 + uVar7] =
                       (uchar)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                               (uint)data[lVar5 * 4 + uVar8 + 1] * 0x96 +
                               (uint)data[lVar5 * 4 + uVar8] * 0x4d >> 8);
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x22:
              if (-1 < iVar3) {
                lVar5 = 0;
                do {
                  bVar1 = data[lVar5 * 4 + uVar8 + 2];
                  puVar4[lVar5 * 2 + uVar7] =
                       (uchar)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                               (uint)data[lVar5 * 4 + uVar8 + 1] * 0x96 +
                               (uint)data[lVar5 * 4 + uVar8] * 0x4d >> 8);
                  puVar4[lVar5 * 2 + uVar7 + 1] = data[lVar5 * 4 + uVar8 + 3];
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
            }
          }
          else {
switchD_0012a56d_caseD_d:
            if (-1 < iVar3) {
              puVar12 = puVar4 + (uint)(iVar11 * req_comp);
              lVar5 = 0;
              do {
                *puVar12 = data[lVar5 * 4 + uVar8];
                puVar12[1] = data[lVar5 * 4 + uVar8 + 1];
                puVar12[2] = data[lVar5 * 4 + uVar8 + 2];
                lVar5 = lVar5 + 1;
                puVar12 = puVar12 + 3;
              } while (x != (uint)lVar5);
            }
          }
          uVar10 = uVar10 + 1;
          uVar7 = (ulong)((int)uVar7 + x * req_comp);
          uVar8 = (ulong)((int)uVar8 + x * img_n);
        } while (uVar10 != y);
      }
      free(data);
    }
  }
  return puVar4;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}